

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O1

spv_result_t
anon_unknown.dwarf_1f7c3c::spvTextEncodeOpcode
          (AssemblyGrammar *grammar,AssemblyContext *context,spv_instruction_t *pInst)

{
  spv_operand_type_t type;
  iterator __position;
  pointer puVar1;
  spv_position_t *psVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  spv_result_t sVar6;
  int iVar7;
  spv_result_t sVar8;
  int32_t iVar9;
  uint32_t uVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  size_type sVar14;
  spv_result_t unaff_EBP;
  char *pcVar15;
  _Alloc_hider _Var16;
  uint uVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  string opcodeName;
  spv_opcode_desc opcodeEntry;
  spv_operand_pattern_t expectedOperands;
  string result_id;
  spv_position_t nextPosition;
  string firstWord;
  string equal_sign;
  spv_position_t temp_pos;
  string local_2e0;
  spv_opcode_desc local_2c0;
  AssemblyGrammar *local_2b8;
  spv_position_t *local_2b0;
  vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_> local_2a8;
  spv_position_t local_288;
  spv_position_t local_268;
  string local_250;
  spv_result_t local_22c;
  string local_228;
  DiagnosticStream local_208;
  
  cVar3 = spvtools::AssemblyContext::peek(context);
  paVar18 = &local_250.field_2;
  local_250._M_dataplus._M_p = (pointer)paVar18;
  if (cVar3 == '!') {
    local_250._M_string_length = 0;
    local_250.field_2._M_local_buf[0] = '\0';
    local_288.index = 0;
    local_288.line = 0;
    local_288.column = 0;
    sVar6 = spvtools::AssemblyContext::getWord(context,&local_250,&local_288);
    if (sVar6 == SPV_SUCCESS) {
      local_2b8 = grammar;
      unaff_EBP = encodeImmediate(context,local_250._M_dataplus._M_p,pInst);
      if (unaff_EBP == SPV_SUCCESS) {
        local_2b0 = &context->current_position_;
        do {
          sVar6 = spvtools::AssemblyContext::advance(context);
          unaff_EBP = SPV_SUCCESS;
          if ((sVar6 == SPV_END_OF_STREAM) ||
             (bVar4 = spvtools::AssemblyContext::isStartOfNewInst(context), bVar4)) break;
          local_2e0._M_string_length = 0;
          local_2e0.field_2._M_local_buf[0] = '\0';
          local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
          sVar6 = spvtools::AssemblyContext::getWord(context,&local_2e0,&local_288);
          if (sVar6 == SPV_SUCCESS) {
            iVar7 = std::__cxx11::string::compare((char *)&local_2e0);
            if (iVar7 == 0) {
              spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length
                        );
              lVar13 = 0x16;
              pcVar15 = " not allowed before =.";
              goto LAB_00184c00;
            }
            local_208._0_8_ = (void *)0x0;
            local_208._8_8_ = 0;
            local_208._16_8_ = 0;
            unaff_EBP = spvTextEncodeOperand
                                  (local_2b8,context,SPV_OPERAND_TYPE_OPTIONAL_CIV,
                                   local_2e0._M_dataplus._M_p,pInst,
                                   (spv_operand_pattern_t *)&local_208);
            bVar4 = unaff_EBP == SPV_SUCCESS;
            if (bVar4) {
              local_2b0->index = local_288.index;
              local_2b0->line = local_288.line;
              local_2b0->column = local_288.column;
              unaff_EBP = (spv_result_t)paVar18;
            }
            if ((void *)local_208._0_8_ != (void *)0x0) {
              operator_delete((void *)local_208._0_8_,local_208._16_8_ - local_208._0_8_);
            }
          }
          else {
            spvtools::AssemblyContext::diagnostic(&local_208,context,sVar6);
            lVar13 = 0xe;
            pcVar15 = "Internal Error";
LAB_00184c00:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar15,lVar13)
            ;
            unaff_EBP = local_208.error_;
            spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
            bVar4 = false;
          }
          paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)(uint)unaff_EBP;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
            operator_delete(local_2e0._M_dataplus._M_p,
                            CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                                     local_2e0.field_2._M_local_buf[0]) + 1);
          }
        } while (bVar4);
      }
    }
    else {
      spvtools::AssemblyContext::diagnostic(&local_208,context,sVar6);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Internal Error",0xe)
      ;
      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
      unaff_EBP = local_208.error_;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_250._M_dataplus._M_p == &local_250.field_2) {
      return unaff_EBP;
    }
    goto LAB_00184a27;
  }
  local_250._M_string_length = 0;
  local_250.field_2._M_local_buf[0] = '\0';
  local_268.index = 0;
  local_268.line = 0;
  local_268.column = 0;
  sVar6 = spvtools::AssemblyContext::getWord(context,&local_250,&local_268);
  if (sVar6 == SPV_SUCCESS) {
    local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
    local_2e0._M_string_length = 0;
    local_2e0.field_2._M_local_buf[0] = '\0';
    local_288.column = 0;
    local_288.index = local_288.index & 0xffffffffffffff00;
    local_2b8 = grammar;
    local_288.line = (size_t)&local_288.index;
    bVar4 = spvtools::AssemblyContext::startsWithOp(context);
    if (bVar4) {
      std::__cxx11::string::_M_assign((string *)&local_2e0);
LAB_00184a93:
      sVar6 = spvtools::AssemblyGrammar::lookupOpcode
                        (local_2b8,local_2e0._M_dataplus._M_p + 2,&local_2c0);
      if (sVar6 == SPV_SUCCESS) {
        if ((local_2c0->hasResult == true) && (local_288.column == 0)) {
          spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,
                     "Expected <result-id> at the beginning of an instruction, found \'",0x40);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_250._M_dataplus._M_p,local_250._M_string_length);
          pcVar15 = "\'.";
          lVar13 = 2;
        }
        else {
          if ((local_2c0->hasResult != false) || (local_288.column == 0)) {
            pInst->opcode = local_2c0->opcode;
            (context->current_position_).index = local_268.index;
            (context->current_position_).line = local_268.line;
            (context->current_position_).column = local_268.column;
            local_208._0_8_ = local_208._0_8_ & 0xffffffff00000000;
            __position._M_current =
                 (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            if (__position._M_current ==
                (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pInst->words,
                         __position,(uint *)&local_208);
            }
            else {
              *__position._M_current = 0;
              (pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_finish = __position._M_current + 1;
            }
            local_2a8.super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
            _M_impl.super__Vector_impl_data._M_start = (spv_operand_type_t *)0x0;
            local_2a8.super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
            _M_impl.super__Vector_impl_data._M_finish = (spv_operand_type_t *)0x0;
            local_2a8.super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage = (spv_operand_type_t *)0x0;
            std::vector<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>::reserve
                      (&local_2a8,(ulong)local_2c0->numTypes);
            uVar12 = (uint)local_2c0->numTypes;
            if (local_2c0->numTypes != 0) {
              uVar17 = 0;
              iVar7 = -1;
              do {
                if (local_2a8.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish ==
                    local_2a8.
                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<spv_operand_type_t,std::allocator<spv_operand_type_t>>::
                  _M_realloc_insert<spv_operand_type_t_const&>
                            ((vector<spv_operand_type_t,std::allocator<spv_operand_type_t>> *)
                             &local_2a8,
                             (iterator)
                             local_2a8.
                             super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish,
                             local_2c0->operandTypes + (int)(uVar12 + iVar7));
                }
                else {
                  *local_2a8.
                   super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                   _M_impl.super__Vector_impl_data._M_finish =
                       local_2c0->operandTypes[(int)(uVar12 + iVar7)];
                  local_2a8.
                  super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish =
                       local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish + 1;
                }
                uVar17 = uVar17 + 1;
                uVar12 = (uint)local_2c0->numTypes;
                iVar7 = iVar7 + -1;
              } while (uVar17 < uVar12);
            }
            if (local_2a8.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_2a8.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_2b0 = &context->current_position_;
              do {
                type = local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish[-1];
                local_2a8.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_2a8.
                     super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish + -1;
                bVar4 = spvExpandOperandSequenceOnce(type,&local_2a8);
                psVar2 = local_2b0;
                iVar7 = 5;
                sVar6 = unaff_EBP;
                if (!bVar4) {
                  if ((type == SPV_OPERAND_TYPE_RESULT_ID) && (local_288.column != 0)) {
                    local_208._16_8_ = local_2b0->index;
                    local_208._0_8_ = local_2b0->line;
                    local_208._8_8_ = local_2b0->column;
                    sVar6 = spvTextEncodeOperand
                                      (local_2b8,context,SPV_OPERAND_TYPE_RESULT_ID,
                                       (char *)local_288.line,pInst,(spv_operand_pattern_t *)0x0);
                    psVar2->line = local_208._0_8_;
                    psVar2->column = local_208._8_8_;
                    psVar2->index = local_208._16_8_;
                    iVar7 = 1;
                    if (sVar6 == SPV_SUCCESS) {
LAB_00185321:
                      iVar7 = 0;
                      sVar6 = unaff_EBP;
                    }
                  }
                  else {
                    sVar8 = spvtools::AssemblyContext::advance(context);
                    if (sVar8 == SPV_SUCCESS) {
                      bVar4 = spvtools::AssemblyContext::isStartOfNewInst(context);
                      if (bVar4) {
                        bVar4 = spvOperandIsOptional(type);
                        iVar7 = 6;
                        if (!bVar4) {
                          spvtools::AssemblyContext::diagnostic
                                    (&local_208,context,SPV_ERROR_INVALID_TEXT);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_208,"Expected operand for ",0x15);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_208,local_2e0._M_dataplus._M_p,
                                     local_2e0._M_string_length);
                          lVar13 = 0x35;
                          pcVar15 = " instruction, but found the next instruction instead.";
                          goto LAB_00185255;
                        }
                      }
                      else {
                        local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
                        local_228._M_string_length = 0;
                        local_228.field_2._M_local_buf[0] = '\0';
                        sVar6 = spvtools::AssemblyContext::getWord(context,&local_228,&local_268);
                        if (sVar6 == SPV_SUCCESS) {
                          sVar6 = spvTextEncodeOperand
                                            (local_2b8,context,type,local_228._M_dataplus._M_p,pInst
                                             ,&local_2a8);
                          if (sVar6 == SPV_SUCCESS) {
LAB_001853a0:
                            local_2b0->index = local_268.index;
                            local_2b0->line = local_268.line;
                            local_2b0->column = local_268.column;
                            bVar4 = true;
                            sVar6 = unaff_EBP;
                          }
                          else if (sVar6 == SPV_FAILED_MATCH) {
                            local_22c = sVar6;
                            bVar5 = spvOperandIsOptional(type);
                            bVar4 = false;
                            sVar6 = SPV_SUCCESS;
                            if (!bVar5) {
                              sVar6 = local_22c;
                              if (local_22c != SPV_SUCCESS) goto LAB_001852f1;
                              goto LAB_001853a0;
                            }
                          }
                          else {
                            bVar4 = false;
                          }
                        }
                        else {
                          spvtools::AssemblyContext::diagnostic(&local_208,context,sVar6);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_208,"Internal Error",0xe);
                          sVar6 = local_208.error_;
                          spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
LAB_001852f1:
                          bVar4 = false;
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_228._M_dataplus._M_p != &local_228.field_2) {
                          operator_delete(local_228._M_dataplus._M_p,
                                          CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                                   local_228.field_2._M_local_buf[0]) + 1);
                        }
                        iVar7 = 1;
                        unaff_EBP = sVar6;
                        if (bVar4) goto LAB_00185321;
                      }
                    }
                    else {
                      if (sVar8 != SPV_END_OF_STREAM) {
                        __assert_fail("error == SPV_SUCCESS && \"Somebody added another way to fail\""
                                      ,
                                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                                      ,0x284,
                                      "spv_result_t (anonymous namespace)::spvTextEncodeOpcode(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, spv_instruction_t *)"
                                     );
                      }
                      bVar4 = spvOperandIsOptional(type);
                      iVar7 = 6;
                      if (!bVar4) {
                        spvtools::AssemblyContext::diagnostic
                                  (&local_208,context,SPV_ERROR_INVALID_TEXT);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,"Expected operand for ",0x15);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,local_2e0._M_dataplus._M_p,
                                   local_2e0._M_string_length);
                        lVar13 = 0x2e;
                        pcVar15 = " instruction, but found the end of the stream.";
LAB_00185255:
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,pcVar15,lVar13);
                        sVar6 = local_208.error_;
                        spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                        iVar7 = 1;
                      }
                    }
                  }
                }
                unaff_EBP = sVar6;
                if ((iVar7 != 0) && (iVar7 != 5)) {
                  if (iVar7 != 6) goto LAB_00185570;
                  break;
                }
              } while (local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_start !=
                       local_2a8.
                       super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
            }
            iVar9 = spvOpcodeGeneratesType(pInst->opcode);
            if (iVar9 == 0) {
              if (local_2c0->hasType == true) {
                if (local_2c0->hasResult == false) {
                  __assert_fail("opcodeEntry->hasResult && \"Unknown opcode: has a type but no result.\""
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/text.cpp"
                                ,0x2a8,
                                "spv_result_t (anonymous namespace)::spvTextEncodeOpcode(const spvtools::AssemblyGrammar &, spvtools::AssemblyContext *, spv_instruction_t *)"
                               );
                }
                puVar1 = (pInst->words).
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_start;
                spvtools::AssemblyContext::recordTypeIdForValue(context,puVar1[2],puVar1[1]);
              }
LAB_0018542a:
              uVar11 = (long)(pInst->words).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)(pInst->words).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start >> 2;
              if (uVar11 < 0x10000) {
                uVar10 = spvOpcodeMake((uint16_t)uVar11,local_2c0->opcode);
                *(pInst->words).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start = uVar10;
                unaff_EBP = SPV_SUCCESS;
              }
              else {
                spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208,local_2e0._M_dataplus._M_p,
                           local_2e0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208," Instruction too long: ",0x17);
                std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&local_208," words, but the limit is ",0x19);
                std::ostream::operator<<(&local_208,0xffff);
                spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
                unaff_EBP = local_208.error_;
              }
            }
            else {
              sVar6 = spvtools::AssemblyContext::recordTypeDefinition(context,pInst);
              unaff_EBP = SPV_ERROR_INVALID_TEXT;
              if (sVar6 == SPV_SUCCESS) goto LAB_0018542a;
            }
LAB_00185570:
            if (local_2a8.
                super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>._M_impl.
                super__Vector_impl_data._M_start != (spv_operand_type_t *)0x0) {
              operator_delete(local_2a8.
                              super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (long)local_2a8.
                                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_2a8.
                                    super__Vector_base<spv_operand_type_t,_std::allocator<spv_operand_type_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
            goto LAB_00184e87;
          }
          spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,"Cannot set ID ",0xe);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,(char *)local_288.line,local_288.column);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208," because ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
          pcVar15 = " does not produce a result ID.";
          lVar13 = 0x1e;
        }
      }
      else {
        spvtools::AssemblyContext::diagnostic(&local_208,context,sVar6);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,"Invalid Opcode name \'",0x15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,local_2e0._M_dataplus._M_p,local_2e0._M_string_length);
        pcVar15 = "\'";
        lVar13 = 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar15,lVar13);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
      unaff_EBP = local_208.error_;
    }
    else {
      std::__cxx11::string::_M_assign((string *)&local_288);
      if (*(char *)local_288.line == '%') {
        (context->current_position_).index = local_268.index;
        (context->current_position_).line = local_268.line;
        (context->current_position_).column = local_268.column;
        sVar6 = spvtools::AssemblyContext::advance(context);
        if (sVar6 == SPV_SUCCESS) {
          local_228._M_string_length = 0;
          local_228.field_2._M_local_buf[0] = '\0';
          local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
          spvtools::AssemblyContext::getWord(context,&local_228,&local_268);
          iVar7 = std::__cxx11::string::compare((char *)&local_228);
          if (iVar7 == 0) {
            (context->current_position_).index = local_268.index;
            (context->current_position_).line = local_268.line;
            (context->current_position_).column = local_268.column;
            sVar6 = spvtools::AssemblyContext::advance(context);
            if (sVar6 != SPV_SUCCESS) {
              spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
              pcVar15 = "Expected opcode, found end of stream.";
              lVar13 = 0x25;
              goto LAB_0018550c;
            }
            sVar6 = spvtools::AssemblyContext::getWord(context,&local_2e0,&local_268);
            if (sVar6 != SPV_SUCCESS) {
              spvtools::AssemblyContext::diagnostic(&local_208,context,sVar6);
              pcVar15 = "Internal Error";
              lVar13 = 0xe;
              goto LAB_0018550c;
            }
            bVar4 = spvtools::AssemblyContext::startsWithOp(context);
            if (!bVar4) {
              spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,"Invalid Opcode prefix \'",0x17);
              sVar14 = local_2e0._M_string_length;
              _Var16._M_p = local_2e0._M_dataplus._M_p;
              goto LAB_00184f54;
            }
            bVar4 = true;
          }
          else {
            spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"\'=\' expected after result id but found \'",0x28);
            sVar14 = local_228._M_string_length;
            _Var16._M_p = local_228._M_dataplus._M_p;
LAB_00184f54:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,_Var16._M_p,sVar14);
            pcVar15 = "\'.";
            lVar13 = 2;
LAB_0018550c:
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar15,lVar13)
            ;
            unaff_EBP = local_208.error_;
            spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
            bVar4 = false;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228._M_dataplus._M_p != &local_228.field_2) {
            operator_delete(local_228._M_dataplus._M_p,
                            CONCAT71(local_228.field_2._M_allocated_capacity._1_7_,
                                     local_228.field_2._M_local_buf[0]) + 1);
          }
          if (bVar4) goto LAB_00184a93;
          goto LAB_00184e87;
        }
        spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
        pcVar15 = "Expected \'=\', found end of stream.";
        lVar13 = 0x22;
      }
      else {
        spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,
                   "Expected <opcode> or <result-id> at the beginning of an instruction, found \'",
                   0x4c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_208,(char *)local_288.line,local_288.column);
        pcVar15 = "\'.";
        lVar13 = 2;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar15,lVar13);
      spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
      unaff_EBP = local_208.error_;
    }
LAB_00184e87:
    if ((size_t *)local_288.line != &local_288.index) {
      operator_delete((void *)local_288.line,local_288.index + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
      operator_delete(local_2e0._M_dataplus._M_p,
                      CONCAT71(local_2e0.field_2._M_allocated_capacity._1_7_,
                               local_2e0.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    spvtools::AssemblyContext::diagnostic(&local_208,context,SPV_ERROR_INVALID_TEXT);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"Internal Error",0xe);
    spvtools::DiagnosticStream::~DiagnosticStream(&local_208);
    unaff_EBP = local_208.error_;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p == &local_250.field_2) {
    return unaff_EBP;
  }
LAB_00184a27:
  operator_delete(local_250._M_dataplus._M_p,
                  CONCAT71(local_250.field_2._M_allocated_capacity._1_7_,
                           local_250.field_2._M_local_buf[0]) + 1);
  return unaff_EBP;
}

Assistant:

spv_result_t spvTextEncodeOpcode(const spvtools::AssemblyGrammar& grammar,
                                 spvtools::AssemblyContext* context,
                                 spv_instruction_t* pInst) {
  // Check for !<integer> first.
  if ('!' == context->peek()) {
    return encodeInstructionStartingWithImmediate(grammar, context, pInst);
  }

  std::string firstWord;
  spv_position_t nextPosition = {};
  spv_result_t error = context->getWord(&firstWord, &nextPosition);
  if (error) return context->diagnostic() << "Internal Error";

  std::string opcodeName;
  std::string result_id;
  spv_position_t result_id_position = {};
  if (context->startsWithOp()) {
    opcodeName = firstWord;
  } else {
    result_id = firstWord;
    if ('%' != result_id.front()) {
      return context->diagnostic()
             << "Expected <opcode> or <result-id> at the beginning "
                "of an instruction, found '"
             << result_id << "'.";
    }
    result_id_position = context->position();

    // The '=' sign.
    context->setPosition(nextPosition);
    if (context->advance())
      return context->diagnostic() << "Expected '=', found end of stream.";
    std::string equal_sign;
    error = context->getWord(&equal_sign, &nextPosition);
    if ("=" != equal_sign)
      return context->diagnostic() << "'=' expected after result id but found '"
                                   << equal_sign << "'.";

    // The <opcode> after the '=' sign.
    context->setPosition(nextPosition);
    if (context->advance())
      return context->diagnostic() << "Expected opcode, found end of stream.";
    error = context->getWord(&opcodeName, &nextPosition);
    if (error) return context->diagnostic(error) << "Internal Error";
    if (!context->startsWithOp()) {
      return context->diagnostic()
             << "Invalid Opcode prefix '" << opcodeName << "'.";
    }
  }

  // NOTE: The table contains Opcode names without the "Op" prefix.
  const char* pInstName = opcodeName.data() + 2;

  spv_opcode_desc opcodeEntry;
  error = grammar.lookupOpcode(pInstName, &opcodeEntry);
  if (error) {
    return context->diagnostic(error)
           << "Invalid Opcode name '" << opcodeName << "'";
  }
  if (opcodeEntry->hasResult && result_id.empty()) {
    return context->diagnostic()
           << "Expected <result-id> at the beginning of an instruction, found '"
           << firstWord << "'.";
  }
  if (!opcodeEntry->hasResult && !result_id.empty()) {
    return context->diagnostic()
           << "Cannot set ID " << result_id << " because " << opcodeName
           << " does not produce a result ID.";
  }
  pInst->opcode = opcodeEntry->opcode;
  context->setPosition(nextPosition);
  // Reserve the first word for the instruction.
  spvInstructionAddWord(pInst, 0);

  // Maintains the ordered list of expected operand types.
  // For many instructions we only need the {numTypes, operandTypes}
  // entries in opcodeEntry.  However, sometimes we need to modify
  // the list as we parse the operands. This occurs when an operand
  // has its own logical operands (such as the LocalSize operand for
  // ExecutionMode), or for extended instructions that may have their
  // own operands depending on the selected extended instruction.
  spv_operand_pattern_t expectedOperands;
  expectedOperands.reserve(opcodeEntry->numTypes);
  for (auto i = 0; i < opcodeEntry->numTypes; i++)
    expectedOperands.push_back(
        opcodeEntry->operandTypes[opcodeEntry->numTypes - i - 1]);

  while (!expectedOperands.empty()) {
    const spv_operand_type_t type = expectedOperands.back();
    expectedOperands.pop_back();

    // Expand optional tuples lazily.
    if (spvExpandOperandSequenceOnce(type, &expectedOperands)) continue;

    if (type == SPV_OPERAND_TYPE_RESULT_ID && !result_id.empty()) {
      // Handle the <result-id> for value generating instructions.
      // We've already consumed it from the text stream.  Here
      // we inject its words into the instruction.
      spv_position_t temp_pos = context->position();
      error = spvTextEncodeOperand(grammar, context, SPV_OPERAND_TYPE_RESULT_ID,
                                   result_id.c_str(), pInst, nullptr);
      result_id_position = context->position();
      // Because we are injecting we have to reset the position afterwards.
      context->setPosition(temp_pos);
      if (error) return error;
    } else {
      // Find the next word.
      error = context->advance();
      if (error == SPV_END_OF_STREAM) {
        if (spvOperandIsOptional(type)) {
          // This would have been the last potential operand for the
          // instruction,
          // and we didn't find one.  We're finished parsing this instruction.
          break;
        } else {
          return context->diagnostic()
                 << "Expected operand for " << opcodeName
                 << " instruction, but found the end of the stream.";
        }
      }
      assert(error == SPV_SUCCESS && "Somebody added another way to fail");

      if (context->isStartOfNewInst()) {
        if (spvOperandIsOptional(type)) {
          break;
        } else {
          return context->diagnostic()
                 << "Expected operand for " << opcodeName
                 << " instruction, but found the next instruction instead.";
        }
      }

      std::string operandValue;
      error = context->getWord(&operandValue, &nextPosition);
      if (error) return context->diagnostic(error) << "Internal Error";

      error = spvTextEncodeOperand(grammar, context, type, operandValue.c_str(),
                                   pInst, &expectedOperands);

      if (error == SPV_FAILED_MATCH && spvOperandIsOptional(type))
        return SPV_SUCCESS;

      if (error) return error;

      context->setPosition(nextPosition);
    }
  }

  if (spvOpcodeGeneratesType(pInst->opcode)) {
    if (context->recordTypeDefinition(pInst) != SPV_SUCCESS) {
      return SPV_ERROR_INVALID_TEXT;
    }
  } else if (opcodeEntry->hasType) {
    // SPIR-V dictates that if an instruction has both a return value and a
    // type ID then the type id is first, and the return value is second.
    assert(opcodeEntry->hasResult &&
           "Unknown opcode: has a type but no result.");
    context->recordTypeIdForValue(pInst->words[2], pInst->words[1]);
  }

  if (pInst->words.size() > SPV_LIMIT_INSTRUCTION_WORD_COUNT_MAX) {
    return context->diagnostic()
           << opcodeName << " Instruction too long: " << pInst->words.size()
           << " words, but the limit is "
           << SPV_LIMIT_INSTRUCTION_WORD_COUNT_MAX;
  }

  pInst->words[0] =
      spvOpcodeMake(uint16_t(pInst->words.size()), opcodeEntry->opcode);

  return SPV_SUCCESS;
}